

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_pcm_deinterleave_s32(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_int32 *src_s32;
  ma_uint64 mVar1;
  ulong uVar2;
  
  if (frameCount != 0) {
    mVar1 = 0;
    do {
      if (channels != 0) {
        uVar2 = 0;
        do {
          *(undefined4 *)((long)dst[uVar2] + mVar1 * 4) = *(undefined4 *)((long)src + uVar2 * 4);
          uVar2 = uVar2 + 1;
        } while (channels != uVar2);
      }
      mVar1 = mVar1 + 1;
      src = (void *)((long)src + (ulong)channels * 4);
    } while (mVar1 != frameCount);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_deinterleave_s32__reference(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
    ma_int32** dst_s32 = (ma_int32**)dst;
    const ma_int32* src_s32 = (const ma_int32*)src;

    ma_uint64 iFrame;
    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; iChannel += 1) {
            dst_s32[iChannel][iFrame] = src_s32[iFrame*channels + iChannel];
        }
    }
}